

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O3

int Aig_ManComputeReachable
              (DdManager *dd,Aig_Man_t *p,DdNode **pbParts,DdNode *bInitial,DdNode **pbOutputs,
              Saig_ParBbr_t *pPars,int fCheckOutputs)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DdNode *pDVar5;
  Bbr_ImageTree_t *pTree;
  Vec_Ptr_t *vOnionRings;
  void **ppvVar6;
  DdNode *pDVar7;
  Abc_Cex_t *pAVar8;
  long lVar9;
  char *__format;
  DdManager *pDVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  ulong local_b0;
  uint local_a4;
  DdNode *local_a0;
  long local_70;
  Cudd_ReorderingType method;
  timespec ts;
  
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    local_70 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_70 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar2 = Cudd_ReorderingStatus(dd,&method);
  if (iVar2 != 0) {
    Cudd_AutodynDisable(dd);
  }
  pDVar5 = Bbr_bddComputeRangeCube(dd,p->nTruePis,p->nRegs + p->nTruePis);
  Cudd_Ref(pDVar5);
  iVar3 = p->nRegs;
  if (pPars->fPartition == 0) {
    Bbr_bddImageStart2(dd,pDVar5,iVar3,pbParts,iVar3,dd->vars + (long)p->nTruePis + (long)iVar3,
                       pPars->fVerbose);
    Cudd_RecursiveDeref(dd,pDVar5);
  }
  else {
    pTree = Bbr_bddImageStart(dd,pDVar5,iVar3,pbParts,iVar3,
                              dd->vars + (long)p->nTruePis + (long)iVar3,pPars->nBddMax,
                              pPars->fVerbose);
    Cudd_RecursiveDeref(dd,pDVar5);
    if (pTree != (Bbr_ImageTree_t *)0x0) {
      if (iVar2 != 0) {
        Cudd_AutodynEnable(dd,method);
      }
      vOnionRings = (Vec_Ptr_t *)malloc(0x10);
      vOnionRings->nCap = 1000;
      vOnionRings->nSize = 0;
      ppvVar6 = (void **)malloc(8000);
      vOnionRings->pArray = ppvVar6;
      Cudd_Ref(bInitial);
      Cudd_Ref(bInitial);
      uVar4 = vOnionRings->nSize;
      if (uVar4 == vOnionRings->nCap) {
        if ((int)uVar4 < 0x10) {
          if (vOnionRings->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vOnionRings->pArray,0x80);
          }
          vOnionRings->pArray = ppvVar6;
          vOnionRings->nCap = 0x10;
        }
        else {
          if (vOnionRings->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vOnionRings->pArray,(ulong)uVar4 << 4);
          }
          vOnionRings->pArray = ppvVar6;
          vOnionRings->nCap = uVar4 * 2;
        }
      }
      else {
        ppvVar6 = vOnionRings->pArray;
      }
      iVar2 = vOnionRings->nSize;
      vOnionRings->nSize = iVar2 + 1;
      ppvVar6[iVar2] = bInitial;
      Cudd_Ref(bInitial);
      if (pPars->nIterMax < 1) {
        local_b0 = 0;
        local_a4 = 0;
        pDVar5 = (DdNode *)0x0;
        local_a0 = bInitial;
LAB_0081fc8c:
        bVar12 = true;
      }
      else {
        local_a4 = 0;
        local_b0 = 0;
        local_a0 = bInitial;
        do {
          iVar2 = pPars->TimeLimit;
          if ((long)iVar2 != 0) {
            iVar3 = clock_gettime(3,(timespec *)&ts);
            if (iVar3 < 0) {
              lVar9 = -1;
            }
            else {
              lVar9 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            if ((long)iVar2 <= (lVar9 + local_70) / 1000000) {
              printf("Reached timeout after image computation (%d seconds).\n",
                     (ulong)(uint)pPars->TimeLimit);
              if (vOnionRings->pArray != (void **)0x0) {
                free(vOnionRings->pArray);
              }
              free(vOnionRings);
              if (pPars->fPartition == 0) {
                Bbr_bddImageTreeDelete2((Bbr_ImageTree2_t *)0x0);
              }
              else {
                Bbr_bddImageTreeDelete(pTree);
              }
              goto LAB_0081fed1;
            }
          }
          if (pPars->fPartition == 0) {
            pDVar7 = Bbr_bddImageCompute2((Bbr_ImageTree2_t *)0x0,bInitial);
          }
          else {
            pDVar7 = Bbr_bddImageCompute(pTree,bInitial);
          }
          if (pDVar7 == (DdNode *)0x0) {
            if (pPars->fSilent == 0) {
              printf("BDDs blew up during image computation.  ");
            }
            if (pPars->fPartition == 0) {
              Bbr_bddImageTreeDelete2((Bbr_ImageTree2_t *)0x0);
            }
            else {
              Bbr_bddImageTreeDelete(pTree);
            }
            if (vOnionRings->pArray != (void **)0x0) {
              free(vOnionRings->pArray);
            }
            free(vOnionRings);
            goto LAB_0081fed1;
          }
          Cudd_Ref(pDVar7);
          Cudd_RecursiveDeref(dd,bInitial);
          pDVar5 = Cudd_bddVarMap(dd,pDVar7);
          Cudd_Ref(pDVar5);
          Cudd_RecursiveDeref(dd,pDVar7);
          iVar2 = Cudd_bddLeq(dd,pDVar5,local_a0);
          bVar12 = iVar2 == 0;
          if (!bVar12) {
            bVar12 = false;
            break;
          }
          local_a4 = Cudd_DagSize(pDVar5);
          if (pPars->nBddMax < (int)local_a4) goto LAB_0081fc8c;
          iVar2 = p->nTruePos;
          uVar11 = 0;
          if (0 < iVar2) {
            do {
              if (fCheckOutputs != 0) {
                iVar2 = Cudd_bddLeq(dd,pDVar5,(DdNode *)((ulong)pbOutputs[uVar11] ^ 1));
                if (iVar2 == 0) {
                  pDVar7 = Cudd_bddIntersect(dd,pDVar5,pbOutputs[uVar11]);
                  Cudd_Ref(pDVar7);
                  if (p->pSeqModel != (Abc_Cex_t *)0x0) {
                    __assert_fail("p->pSeqModel == NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                                  ,0x151,
                                  "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                                 );
                  }
                  pAVar8 = Aig_ManVerifyUsingBddsCountExample
                                     (p,dd,pbParts,vOnionRings,pDVar7,(int)uVar11,pPars->fVerbose,
                                      pPars->fSilent);
                  p->pSeqModel = pAVar8;
                  pDVar10 = dd;
                  Cudd_RecursiveDeref(dd,pDVar7);
                  if (pPars->fSilent == 0) {
                    Abc_Print((int)pDVar10,"Output %d of miter \"%s\" was asserted in frame %d. ",
                              uVar11 & 0xffffffff,p->pName,(ulong)(uint)vOnionRings->nSize);
                  }
                  Cudd_RecursiveDeref(dd,local_a0);
                  pPars->iFrame = (int)local_b0;
                  iVar2 = p->nTruePos;
                  local_a0 = (DdNode *)0x0;
                  break;
                }
                iVar2 = p->nTruePos;
              }
              uVar11 = uVar11 + 1;
            } while ((long)uVar11 < (long)iVar2);
          }
          if ((int)uVar11 < iVar2) break;
          bInitial = Cudd_bddAnd(dd,pDVar5,(DdNode *)((ulong)local_a0 ^ 1));
          Cudd_Ref(bInitial);
          uVar4 = vOnionRings->nSize;
          if (uVar4 == vOnionRings->nCap) {
            if ((int)uVar4 < 0x10) {
              if (vOnionRings->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vOnionRings->pArray,0x80);
              }
              vOnionRings->pArray = ppvVar6;
              vOnionRings->nCap = 0x10;
            }
            else {
              if (vOnionRings->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vOnionRings->pArray,(ulong)uVar4 << 4);
              }
              vOnionRings->pArray = ppvVar6;
              vOnionRings->nCap = uVar4 * 2;
            }
          }
          else {
            ppvVar6 = vOnionRings->pArray;
          }
          iVar2 = vOnionRings->nSize;
          vOnionRings->nSize = iVar2 + 1;
          ppvVar6[iVar2] = bInitial;
          Cudd_Ref(bInitial);
          pDVar7 = Cudd_bddOr(dd,local_a0,pDVar5);
          Cudd_Ref(pDVar7);
          Cudd_RecursiveDeref(dd,local_a0);
          Cudd_RecursiveDeref(dd,pDVar5);
          if (((pPars->fVerbose != 0) &&
              (fprintf(_stdout,"Frame = %3d. BDD = %5d. ",local_b0,(ulong)local_a4),
              pPars->fVerbose != 0)) && (fputc(10,_stdout), pPars->fVerbose != 0)) {
            dVar13 = Cudd_CountMinterm(dd,pDVar7,p->nRegs);
            pFVar1 = _stdout;
            dVar14 = ldexp(1.0,p->nRegs);
            fprintf(pFVar1,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar13,
                    (dVar13 * 100.0) / dVar14);
            fflush(_stdout);
          }
          uVar4 = (int)local_b0 + 1;
          local_b0 = (ulong)uVar4;
          local_a0 = pDVar7;
        } while ((int)uVar4 < pPars->nIterMax);
      }
      Cudd_RecursiveDeref(dd,pDVar5);
      if (0 < vOnionRings->nSize) {
        lVar9 = 0;
        do {
          Cudd_RecursiveDeref(dd,(DdNode *)vOnionRings->pArray[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < vOnionRings->nSize);
      }
      if (vOnionRings->pArray != (void **)0x0) {
        free(vOnionRings->pArray);
      }
      free(vOnionRings);
      if (pPars->fPartition == 0) {
        Bbr_bddImageTreeDelete2((Bbr_ImageTree2_t *)0x0);
      }
      else {
        Bbr_bddImageTreeDelete(pTree);
      }
      if (local_a0 == (DdNode *)0x0) {
        return 0;
      }
      iVar2 = (int)local_b0;
      if (pPars->fVerbose != 0) {
        dVar13 = Cudd_CountMinterm(dd,local_a0,p->nRegs);
        if (pPars->nIterMax < iVar2) {
          __format = "Reachability analysis is stopped after %d frames.\n";
        }
        else {
          __format = "Reachability analysis completed after %d frames.\n";
          if (pPars->nBddMax < (int)local_a4) {
            __format = "Reachability analysis is stopped after %d frames.\n";
          }
        }
        fprintf(_stdout,__format,local_b0);
        pFVar1 = _stdout;
        dVar14 = ldexp(1.0,p->nRegs);
        fprintf(pFVar1,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar13,
                (dVar13 * 100.0) / dVar14);
        fflush(_stdout);
      }
      Cudd_RecursiveDeref(dd,local_a0);
      if (!bVar12) {
        if (pPars->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",local_b0);
        }
        pPars->iFrame = iVar2 + -1;
        return 1;
      }
      if ((iVar2 < pPars->nIterMax) && ((int)local_a4 < pPars->nBddMax)) {
        __assert_fail("nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                      ,0x1a4,
                      "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                     );
      }
      if (pPars->fSilent == 0) {
        printf("Verified only for states reachable in %d frames.  ",local_b0);
      }
LAB_0081fed1:
      pPars->iFrame = (int)local_b0 + -1;
      return -1;
    }
  }
  if (pPars->fSilent == 0) {
    printf("BDDs blew up during qualitification scheduling.  ");
  }
  return -1;
}

Assistant:

int Aig_ManComputeReachable( DdManager * dd, Aig_Man_t * p, DdNode ** pbParts, DdNode * bInitial, DdNode ** pbOutputs, Saig_ParBbr_t * pPars, int fCheckOutputs )
{
    int fInternalReorder = 0;
    Bbr_ImageTree_t * pTree = NULL; // Suppress "might be used uninitialized"
    Bbr_ImageTree2_t * pTree2 = NULL; // Supprses "might be used uninitialized"
    DdNode * bReached, * bCubeCs;
    DdNode * bCurrent;
    DdNode * bNext = NULL; // Suppress "might be used uninitialized"
    DdNode * bTemp;
    Cudd_ReorderingType method;
    int i, nIters, nBddSize = 0, status;
    int nThreshold = 10000;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;
    int fixedPoint = 0;

    status = Cudd_ReorderingStatus( dd, &method );
    if ( status )
        Cudd_AutodynDisable( dd );

    // start the image computation
    bCubeCs  = Bbr_bddComputeRangeCube( dd, Saig_ManPiNum(p), Saig_ManCiNum(p) );    Cudd_Ref( bCubeCs );
    if ( pPars->fPartition )
        pTree = Bbr_bddImageStart( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->nBddMax, pPars->fVerbose );
    else
        pTree2 = Bbr_bddImageStart2( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->fVerbose );
    Cudd_RecursiveDeref( dd, bCubeCs );
    if ( pTree == NULL )
    {
        if ( !pPars->fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return -1;
    }

    if ( status )
        Cudd_AutodynEnable( dd, method );

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // perform reachability analysis
    bCurrent = bInitial;   Cudd_Ref( bCurrent );
    bReached = bInitial;   Cudd_Ref( bReached );
    Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
    for ( nIters = 0; nIters < pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
        {
            printf( "Reached timeout after image computation (%d seconds).\n",  pPars->TimeLimit );
            Vec_PtrFree( vOnionRings );
            // undo the image tree
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            pPars->iFrame = nIters - 1;
            return -1;
        }

        // compute the next states
        if ( pPars->fPartition )
            bNext = Bbr_bddImageCompute( pTree, bCurrent );           
        else
            bNext = Bbr_bddImageCompute2( pTree2, bCurrent );  
        if ( bNext == NULL )
        {
            if ( !pPars->fSilent )
                printf( "BDDs blew up during image computation.  " );
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            Vec_PtrFree( vOnionRings );
            pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bCurrent );

        // remap these states into the current state vars
        bNext = Cudd_bddVarMap( dd, bTemp = bNext );                    Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bTemp );
        // check if there are any new states
        if ( Cudd_bddLeq( dd, bNext, bReached ) ) {
            fixedPoint = 1;
            break;
        }
        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > pPars->nBddMax )
            break;
        // check the result
        for ( i = 0; i < Saig_ManPoNum(p); i++ )
        {
            if ( fCheckOutputs && !Cudd_bddLeq( dd, bNext, Cudd_Not(pbOutputs[i]) ) )
            {
                DdNode * bIntersect;
                bIntersect = Cudd_bddIntersect( dd, bNext, pbOutputs[i] );  Cudd_Ref( bIntersect );
                assert( p->pSeqModel == NULL );
                p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                    vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
                Cudd_RecursiveDeref( dd, bIntersect );
                if ( !pPars->fSilent )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, Vec_PtrSize(vOnionRings) );
                Cudd_RecursiveDeref( dd, bReached );
                bReached = NULL;
                pPars->iFrame = nIters;
                break;
            }
        }
        if ( i < Saig_ManPoNum(p) )
            break;
        // get the new states
        bCurrent = Cudd_bddAnd( dd, bNext, Cudd_Not(bReached) );        Cudd_Ref( bCurrent );
        Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( dd, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( dd, bTemp );
        // add to the reached states
        bReached = Cudd_bddOr( dd, bTemp = bReached, bNext );           Cudd_Ref( bReached );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bNext );
        if ( pPars->fVerbose )
            fprintf( stdout, "Frame = %3d. BDD = %5d. ", nIters, nBddSize );
        if ( fInternalReorder && pPars->fReorder && nBddSize > nThreshold )
        {
            if ( pPars->fVerbose )
                fprintf( stdout, "Reordering... Before = %5d. ", Cudd_DagSize(bReached) );
            Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
            Cudd_AutodynDisable( dd );
            if ( pPars->fVerbose )
                fprintf( stdout, "After = %5d.\r", Cudd_DagSize(bReached) );
            nThreshold *= 2;
        }
        if ( pPars->fVerbose )
//            fprintf( stdout, "\r" );
            fprintf( stdout, "\n" );

        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
//            Extra_bddPrint( dd, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
            fflush( stdout ); 
        }

    }
    Cudd_RecursiveDeref( dd, bNext );
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // undo the image tree
    if ( pPars->fPartition )
        Bbr_bddImageTreeDelete( pTree );
    else
        Bbr_bddImageTreeDelete2( pTree2 );
    if ( bReached == NULL )
        return 0; // proved reachable
    // report the stats
    if ( pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
        if ( nIters > pPars->nIterMax || nBddSize > pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
        fflush( stdout );
    }
//ABC_PRB( dd, bReached );
    Cudd_RecursiveDeref( dd, bReached );
    // SPG
    //
    if ( fixedPoint ) {
      if ( !pPars->fSilent ) {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
      }
      pPars->iFrame = nIters - 1;
      return 1;
    }
    assert(nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax);
    if ( !pPars->fSilent )
      printf( "Verified only for states reachable in %d frames.  ", nIters );
    pPars->iFrame = nIters - 1;
    return -1; // undecided
}